

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall ocl::KernelSource::precompile(KernelSource *this,bool printLog)

{
  undefined1 local_40 [24];
  Context context;
  bool printLog_local;
  KernelSource *this_local;
  
  context.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = printLog;
  gpu::Context::Context((Context *)(local_40 + 0x10));
  gpu::Context::cl((Context *)local_40);
  precompile(this,(shared_ptr<ocl::OpenCLEngine> *)local_40,
             (bool)(context.data_ref_.
                    super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi._7_1_ & 1));
  std::shared_ptr<ocl::OpenCLEngine>::~shared_ptr((shared_ptr<ocl::OpenCLEngine> *)local_40);
  gpu::Context::~Context((Context *)(local_40 + 0x10));
  return;
}

Assistant:

void KernelSource::precompile(bool printLog) {
	gpu::Context context;

	precompile(context.cl(), printLog);
}